

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O0

void CB_EXPLORE::predict_or_learn_greedy<false>(cb_explore *data,single_learner *base,example *ec)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long in_RDX;
  long in_RDI;
  uint32_t i;
  action_scores probs;
  size_t in_stack_00000178;
  v_array<ACTION_SCORE::action_score> *in_stack_00000180;
  action_score *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  example *in_stack_ffffffffffffff98;
  learner<char,_example> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  score_iterator *pdf_first;
  undefined8 uVar4;
  
  pdf_first = *(score_iterator **)(in_RDX + 0x6850);
  uVar4 = *(undefined8 *)(in_RDX + 0x6858);
  uVar1 = *(undefined8 *)(in_RDX + 0x6860);
  uVar2 = *(undefined8 *)(in_RDX + 0x6868);
  v_array<ACTION_SCORE::action_score>::clear
            ((v_array<ACTION_SCORE::action_score> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  LEARNER::learner<char,_example>::predict
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  v_array<ACTION_SCORE::action_score>::resize(in_stack_00000180,in_stack_00000178);
  for (uVar3 = 0; uVar3 < *(uint *)(in_RDI + 0x10); uVar3 = uVar3 + 1) {
    in_stack_ffffffffffffffc0 = 0;
    v_array<ACTION_SCORE::action_score>::push_back
              ((v_array<ACTION_SCORE::action_score> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
  }
  ACTION_SCORE::begin_scores((action_scores *)in_stack_ffffffffffffff98);
  ACTION_SCORE::end_scores((action_scores *)in_stack_ffffffffffffff98);
  exploration::generate_epsilon_greedy<ACTION_SCORE::score_iterator>
            ((float)((ulong)uVar4 >> 0x20),(uint32_t)uVar4,pdf_first,
             (score_iterator *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
  *(score_iterator **)(in_RDX + 0x6850) = pdf_first;
  *(undefined8 *)(in_RDX + 0x6858) = uVar4;
  *(undefined8 *)(in_RDX + 0x6860) = uVar1;
  *(undefined8 *)(in_RDX + 0x6868) = uVar2;
  return;
}

Assistant:

void predict_or_learn_greedy(cb_explore& data, single_learner& base, example& ec)
{
  // Explore uniform random an epsilon fraction of the time.
  // TODO: pointers are copied here. What happens if base.learn/base.predict re-allocs?
  // ec.pred.a_s = probs; will restore the than free'd memory
  action_scores probs = ec.pred.a_s;
  probs.clear();

  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);

  // pre-allocate pdf
  probs.resize(data.cbcs.num_actions);
  for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0});
  generate_epsilon_greedy(data.epsilon, ec.pred.multiclass - 1, begin_scores(probs), end_scores(probs));

  ec.pred.a_s = probs;
}